

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3PagerOpenWal(Pager *pPager,int *pbOpen)

{
  sqlite3_file *psVar1;
  sqlite3_io_methods *psVar2;
  int iVar3;
  
  if ((pPager->tempFile == '\0') && (pPager->pWal == (Wal *)0x0)) {
    if (pPager->noLock != '\0') {
      return 0xe;
    }
    if (pPager->exclusiveMode == '\0') {
      psVar2 = pPager->fd->pMethods;
      if (psVar2->iVersion < 2) {
        return 0xe;
      }
      if (psVar2->xShmMap == (_func_int_sqlite3_file_ptr_int_int_int_void_ptr_ptr *)0x0) {
        return 0xe;
      }
    }
    psVar1 = pPager->jfd;
    if (psVar1->pMethods != (sqlite3_io_methods *)0x0) {
      (*psVar1->pMethods->xClose)(psVar1);
      psVar1->pMethods = (sqlite3_io_methods *)0x0;
    }
    iVar3 = pagerOpenWal(pPager);
    if (iVar3 != 0) {
      return iVar3;
    }
    pPager->journalMode = '\x05';
    pPager->eState = '\0';
  }
  else {
    *pbOpen = 1;
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerOpenWal(
  Pager *pPager,                  /* Pager object */
  int *pbOpen                     /* OUT: Set to true if call is a no-op */
){
  int rc = SQLITE_OK;             /* Return code */

  assert( assert_pager_state(pPager) );
  assert( pPager->eState==PAGER_OPEN   || pbOpen );
  assert( pPager->eState==PAGER_READER || !pbOpen );
  assert( pbOpen==0 || *pbOpen==0 );
  assert( pbOpen!=0 || (!pPager->tempFile && !pPager->pWal) );

  if( !pPager->tempFile && !pPager->pWal ){
    if( !sqlite3PagerWalSupported(pPager) ) return SQLITE_CANTOPEN;

    /* Close any rollback journal previously open */
    sqlite3OsClose(pPager->jfd);

    rc = pagerOpenWal(pPager);
    if( rc==SQLITE_OK ){
      pPager->journalMode = PAGER_JOURNALMODE_WAL;
      pPager->eState = PAGER_OPEN;
    }
  }else{
    *pbOpen = 1;
  }

  return rc;
}